

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtypes.h
# Opt level: O2

vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> * __thiscall
wasm::SubTypes::getImmediateSubTypes(SubTypes *this,HeapType type)

{
  bool bVar1;
  int iVar2;
  const_iterator cVar3;
  HeapType local_18;
  HeapType type_local;
  
  local_18.id = type.id;
  if ((getImmediateSubTypes(wasm::HeapType)::empty == '\0') &&
     (iVar2 = __cxa_guard_acquire(&getImmediateSubTypes(wasm::HeapType)::empty), iVar2 != 0)) {
    getImmediateSubTypes::empty.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    getImmediateSubTypes::empty.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    getImmediateSubTypes::empty.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __cxa_atexit(std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector,
                 &getImmediateSubTypes::empty,&__dso_handle);
    __cxa_guard_release(&getImmediateSubTypes(wasm::HeapType)::empty);
  }
  bVar1 = HeapType::isBottom(&local_18);
  if (!bVar1) {
    if (local_18.id < 0x7d) {
      __assert_fail("!type.isBasic()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/subtypes.h"
                    ,0x31,
                    "const std::vector<HeapType> &wasm::SubTypes::getImmediateSubTypes(HeapType) const"
                   );
    }
    cVar3 = std::
            _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->typeSubTypes)._M_h,&local_18);
    if (cVar3.
        super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      return (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
             ((long)cVar3.
                    super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>
                    ._M_cur + 0x10);
    }
  }
  return &getImmediateSubTypes::empty;
}

Assistant:

const std::vector<HeapType>& getImmediateSubTypes(HeapType type) const {
    // When we return an empty result, use a canonical constant empty vec to
    // avoid allocation.
    static const std::vector<HeapType> empty;

    if (type.isBottom()) {
      // Bottom types have no subtypes.
      return empty;
    }

    assert(!type.isBasic());
    if (auto iter = typeSubTypes.find(type); iter != typeSubTypes.end()) {
      return iter->second;
    }

    // No entry exists.
    return empty;
  }